

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.h
# Opt level: O1

void __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::TextbookBoyerMoore(TextbookBoyerMoore<char16_t> *this)

{
  (this->lastOccurrence).isInMap.data[2].word = 0;
  (this->lastOccurrence).isInMap.data[3].word = 0;
  (this->lastOccurrence).isInMap.data[0].word = 0;
  (this->lastOccurrence).isInMap.data[1].word = 0;
  (this->lastOccurrence).defv = -1;
  (this->lastOccurrence).root = (Type)0x0;
  memset((this->lastOccurrence).directMap,0xff,0x400);
  (this->goodSuffix).ptr = (int *)0x0;
  return;
}

Assistant:

inline TextbookBoyerMoore() : lastOccurrence(-1), goodSuffix(nullptr) {}